

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall GEO::Logger::notify_out(Logger *this,string *message)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  long *plVar3;
  LoggerClient *pLVar4;
  _Base_ptr p_Var5;
  long *plVar6;
  SmartPointer<GEO::LoggerClient> it;
  string feat_msg;
  string local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if (((this->log_everything_ != true) ||
      (iVar2 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(this->log_features_exclude_)._M_t,&this->current_feature_),
      (_Rb_tree_header *)iVar2._M_node !=
      &(this->log_features_exclude_)._M_t._M_impl.super__Rb_tree_header)) &&
     (iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->log_features_)._M_t,&this->current_feature_),
     (_Rb_tree_header *)iVar2._M_node == &(this->log_features_)._M_t._M_impl.super__Rb_tree_header))
  {
    return;
  }
  CmdLine::ui_feature(&local_70,&this->current_feature_,this->current_feature_changed_);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(message->_M_dataplus)._M_p);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  p_Var5 = (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->clients_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      local_70._M_dataplus._M_p = *(pointer *)(p_Var5 + 1);
      if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
        *(int *)((long)local_70._M_dataplus._M_p + 8) =
             (int)*(long *)((long)local_70._M_dataplus._M_p + 8) + 1;
      }
      pLVar4 = SmartPointer<GEO::LoggerClient>::operator->
                         ((SmartPointer<GEO::LoggerClient> *)&local_70);
      (*(pLVar4->super_Counted)._vptr_Counted[3])(pLVar4,&local_50);
      if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
        plVar3 = (long *)(local_70._M_dataplus._M_p + 8);
        *(int *)plVar3 = (int)*plVar3 + -1;
        if ((int)*plVar3 == 0) {
          (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  this->current_feature_changed_ = false;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void Logger::notify_out(const std::string& message) {
        if(
            (log_everything_ &&
                log_features_exclude_.find(current_feature_) ==
                log_features_exclude_.end())
            || (log_features_.find(current_feature_) != log_features_.end())
        ) {
            std::string feat_msg =
                CmdLine::ui_feature(current_feature_, current_feature_changed_)
                + message;

	    for(auto it : clients_) {
                it->out(feat_msg);
            }

            current_feature_changed_ = false;
        }
    }